

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopCheaperProperSubset(WhereLoop *pX,WhereLoop *pY)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (ulong)pX->nLTerm;
  uVar1 = pX->nSkip;
  uVar2 = pY->nSkip;
  if ((int)((uint)pX->nLTerm - (uint)uVar1) < (int)((uint)pY->nLTerm - (uint)uVar2)) {
    if (pY->rRun < pX->rRun) {
      if (uVar1 < uVar2) {
        return 0;
      }
      if (pY->nOut < pX->nOut) {
        return 0;
      }
    }
    else if (uVar1 < uVar2) {
      return 0;
    }
    while (0 < (long)uVar5) {
      lVar3 = uVar5 - 1;
      uVar5 = uVar5 - 1;
      uVar6 = (ulong)pY->nLTerm;
      if (pX->aLTerm[lVar3] != (WhereTerm *)0x0) {
        do {
          if ((long)uVar6 < 1) {
            return 0;
          }
          lVar4 = uVar6 - 1;
          uVar6 = uVar6 - 1;
        } while (pY->aLTerm[lVar4] != pX->aLTerm[lVar3]);
      }
    }
    if (((pX->wsFlags & 0x40) == 0) || ((pY->wsFlags & 0x40) != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int whereLoopCheaperProperSubset(
  const WhereLoop *pX,       /* First WhereLoop to compare */
  const WhereLoop *pY        /* Compare against this WhereLoop */
){
  int i, j;
  if( pX->nLTerm-pX->nSkip >= pY->nLTerm-pY->nSkip ){
    return 0; /* X is not a subset of Y */
  }
  if( pX->rRun>pY->rRun && pX->nOut>pY->nOut ) return 0;
  if( pY->nSkip > pX->nSkip ) return 0;
  for(i=pX->nLTerm-1; i>=0; i--){
    if( pX->aLTerm[i]==0 ) continue;
    for(j=pY->nLTerm-1; j>=0; j--){
      if( pY->aLTerm[j]==pX->aLTerm[i] ) break;
    }
    if( j<0 ) return 0;  /* X not a subset of Y since term X[i] not used by Y */
  }
  if( (pX->wsFlags&WHERE_IDX_ONLY)!=0
   && (pY->wsFlags&WHERE_IDX_ONLY)==0 ){
    return 0;  /* Constraint (5) */
  }
  return 1;  /* All conditions meet */
}